

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2cirs.cpp
# Opt level: O2

void PrintResults(CEExecOptions *inputs,CESkyCoord *results)

{
  double dVar1;
  CEAngle CStack_68;
  CEDate local_58;
  
  putchar(10);
  puts("******************************************");
  puts("* Results of Galactic -> CIRS conversion *");
  puts("******************************************");
  puts("CIRS Coordinates (output)");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*results->_vptr_CESkyCoord[3])(&CStack_68,results,&local_58);
  CEAngle::Deg(&CStack_68);
  printf("    Right Ascension: %f degrees\n");
  CEAngle::~CEAngle(&CStack_68);
  CEDate::~CEDate(&local_58);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*results->_vptr_CESkyCoord[4])(&CStack_68,results,&local_58);
  CEAngle::Deg(&CStack_68);
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(&CStack_68);
  CEDate::~CEDate(&local_58);
  puts("Galactic Coordinates (input)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"glon",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Galactic Lon.  : %f degrees\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"glat",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Galactic Lat.  : %+f degrees\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"juliandate",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Julian Date    : %f\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of Galactic -> CIRS conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("CIRS Coordinates (output)\n") ;
    std::printf("    Right Ascension: %f degrees\n", results.XCoord().Deg());
    std::printf("    Declination    : %+f degrees\n", results.YCoord().Deg());
    std::printf("Galactic Coordinates (input)\n");
    std::printf("    Galactic Lon.  : %f degrees\n", inputs.AsDouble("glon"));
    std::printf("    Galactic Lat.  : %+f degrees\n", inputs.AsDouble("glat"));
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate"));
    std::printf("\n");
}